

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O2

float __thiscall
deqp::gles2::Performance::anon_unknown_1::OperatorPerformanceCase::WorkloadRecord::getMedianTime
          (WorkloadRecord *this)

{
  ulong uVar1;
  float fVar2;
  vector<float,_std::allocator<float>_> times;
  _Vector_base<float,_std::allocator<float>_> local_20;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_20,&this->frameTimes);
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_20._M_impl.super__Vector_impl_data._M_start,
             local_20._M_impl.super__Vector_impl_data._M_finish);
  uVar1 = (ulong)((long)local_20._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_20._M_impl.super__Vector_impl_data._M_start >> 2) >> 1;
  if (((long)local_20._M_impl.super__Vector_impl_data._M_finish -
       (long)local_20._M_impl.super__Vector_impl_data._M_start & 4U) == 0) {
    fVar2 = (local_20._M_impl.super__Vector_impl_data._M_start[uVar1 - 1] +
            local_20._M_impl.super__Vector_impl_data._M_start[uVar1]) * 0.5;
  }
  else {
    fVar2 = local_20._M_impl.super__Vector_impl_data._M_start[uVar1];
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_20);
  return fVar2;
}

Assistant:

float	getMedianTime	(void) const
		{
			vector<float> times = frameTimes;
			std::sort(times.begin(), times.end());
			return times.size() % 2 == 0 ?
					(times[times.size()/2-1] + times[times.size()/2])*0.5f :
					times[times.size()/2];
		}